

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

ssize_t __thiscall BloomFilter::write(BloomFilter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  undefined1 local_38 [28];
  int j;
  char temp;
  char *pcStack_18;
  int i;
  ofstream *out_local;
  BloomFilter *this_local;
  
  pcStack_18 = (char *)CONCAT44(in_register_00000034,__fd);
  out_local = (ofstream *)this;
  uVar2 = std::ostream::seekp((long)pcStack_18,0x20);
  j = 0;
  while (j < 0x14000) {
    local_38[0x1b] = 0;
    for (local_38._20_4_ = 0; (int)local_38._20_4_ < 8; local_38._20_4_ = local_38._20_4_ + 1) {
      std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_38,(size_t)this);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_38);
      local_38[0x1b] = local_38[0x1b] | bVar1 << ((byte)local_38._20_4_ & 0x1f);
      std::bitset<81920UL>::reference::~reference((reference *)local_38);
    }
    std::ostream::write(pcStack_18,(long)(local_38 + 0x1b));
    j = j + 8;
    uVar2 = (ulong)(uint)j;
  }
  return uVar2;
}

Assistant:

void BloomFilter::write(ofstream &out) {
  out.seekp(32, std::ofstream::beg);
  for (int i = 0; i < 10240 * 8; i += 8) {
    char temp = false;
    for (int j = 0; j <= 7; j++)
      temp |=
          bits[i + j] << j;  // NOLINT(cppcoreguidelines-narrowing-conversions)
    out.write(&temp, sizeof(temp));
  }
}